

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O2

void __thiscall solitaire::graphics::Renderer::renderButtons(Renderer *this)

{
  GraphicsSystem *pGVar1;
  uint local_30;
  uint local_2c;
  undefined8 local_28;
  undefined8 local_20;
  
  setButtonsAlpha(this);
  pGVar1 = (this->graphicsSystem)._M_t.
           super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
           _M_head_impl;
  local_2c = (this->newGameId).t;
  local_28 = 0;
  local_20 = 0x110000003a;
  (*pGVar1->_vptr_GraphicsSystem[5])(pGVar1,&local_2c,&Layout::newGameButtonPosition,&local_28);
  pGVar1 = (this->graphicsSystem)._M_t.
           super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
           _M_head_impl;
  local_30 = (this->undoId).t;
  local_28 = 0;
  local_20 = 0x1100000022;
  (*pGVar1->_vptr_GraphicsSystem[5])(pGVar1,&local_30,&Layout::undoButtonPosition,&local_28);
  return;
}

Assistant:

void Renderer::renderButtons() const {
    setButtonsAlpha();

    graphicsSystem->renderTexture(
        newGameId, Layout::newGameButtonPosition,
        Area {Position {0, 0}, Layout::newGameButtonSize});

    graphicsSystem->renderTexture(
        undoId, Layout::undoButtonPosition,
        Area {Position {0, 0}, Layout::undoButtonSize});
}